

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O2

QList<QGesture_*> * __thiscall
QGestureEvent::canceledGestures(QList<QGesture_*> *__return_storage_ptr__,QGestureEvent *this)

{
  QGesture **ppQVar1;
  long lVar2;
  parameter_type t;
  long lVar3;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGesture **)0x0;
  (__return_storage_ptr__->d).size = 0;
  ppQVar1 = (this->m_gestures).d.ptr;
  lVar2 = (this->m_gestures).d.size;
  for (lVar3 = 0; lVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    t = *(parameter_type *)((long)ppQVar1 + lVar3);
    if (*(int *)(*(long *)&t->field_0x8 + 0x7c) == 4) {
      QList<QGesture_*>::append(__return_storage_ptr__,t);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QGesture *> QGestureEvent::canceledGestures() const
{
    QList<QGesture *> gestures;
    for (QGesture *gesture : m_gestures) {
        if (gesture->state() == Qt::GestureCanceled)
            gestures.append(gesture);
    }
    return gestures;
}